

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::positiveTesting
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  bool bVar1;
  bool bVar2;
  GLint GVar3;
  GLenum GVar4;
  GLint pageSizeY;
  GLint pageSizeX;
  GLint pageSizeZ;
  GLuint texture;
  
  std::operator<<((ostream *)&this->field_0x88,"Positive Testing - ");
  gl4cts::Texture::Generate(gl,&texture);
  gl4cts::Texture::Bind(gl,texture,target);
  GVar3 = SparseTextureUtils::getTargetDepth(target);
  SparseTextureUtils::getTexturePageSizes(gl,target,format,&pageSizeX,&pageSizeY,&pageSizeZ);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar4 = (*gl->getError)();
  bVar2 = false;
  bVar1 = SparseTextureUtils::verifyError(&this->mLog,"texParameteri",GVar4,0);
  if (bVar1) {
    if ((target == 0x8513) || (target == 0x9009)) {
      if (pageSizeY < pageSizeX) {
        pageSizeY = pageSizeX;
      }
      else if (pageSizeX < pageSizeY) {
        pageSizeX = pageSizeY;
      }
    }
    gl4cts::Texture::Storage(gl,target,1,format,pageSizeX,pageSizeY,GVar3 * pageSizeZ);
    GVar4 = (*gl->getError)();
    bVar2 = SparseTextureUtils::verifyError(&this->mLog,"Texture::Storage",GVar4,0);
  }
  gl4cts::Texture::Delete(gl,&texture);
  return bVar2;
}

Assistant:

bool SparseTextureAllocationTestCase::positiveTesting(const Functions& gl, GLint target, GLint format)
{
	mLog << "Positive Testing - ";

	GLuint texture;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint pageSizeX;
	GLint pageSizeY;
	GLint pageSizeZ;
	GLint depth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyError(mLog, "texParameteri", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (pageSizeX > pageSizeY)
			pageSizeY = pageSizeX;
		else if (pageSizeX < pageSizeY)
			pageSizeX = pageSizeY;
	}

	Texture::Storage(gl, target, 1, format, pageSizeX, pageSizeY, depth * pageSizeZ);
	if (!SparseTextureUtils::verifyError(mLog, "Texture::Storage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}